

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int extraout_EAX;
  sqlite3_stmt *psVar2;
  undefined4 in_register_00000034;
  double in_XMM0_Qa;
  int ret;
  int index;
  double aValue_local;
  char *apName_local;
  Statement *this_local;
  
  psVar2 = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  iVar1 = sqlite3_bind_parameter_index(psVar2,(char *)CONCAT44(in_register_00000034,__fd));
  psVar2 = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  iVar1 = sqlite3_bind_double(psVar2,iVar1,in_XMM0_Qa);
  check(this,iVar1);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const char* apName, const double aValue)
{
    const int index = sqlite3_bind_parameter_index(mStmtPtr, apName);
    const int ret = sqlite3_bind_double(mStmtPtr, index, aValue);
    check(ret);
}